

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O1

RingBuffer<std::function<void_()>_*> * __thiscall
quickpool::sched::RingBuffer<std::function<void_()>_*>::enlarged_copy
          (RingBuffer<std::function<void_()>_*> *this,size_t bottom,size_t top)

{
  ulong uVar1;
  ulong uVar2;
  RingBuffer<std::function<void_()>_*> *pRVar3;
  _Head_base<0UL,_std::function<void_()>_**,_false> _Var4;
  size_t i;
  
  pRVar3 = (RingBuffer<std::function<void_()>_*> *)operator_new(0x18);
  uVar2 = this->capacity_ * 2;
  _Var4._M_head_impl =
       (function<void_()> **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | this->capacity_ << 4);
  (pRVar3->buffer_)._M_t.
  super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
  .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl = _Var4._M_head_impl;
  pRVar3->capacity_ = uVar2;
  pRVar3->mask_ = uVar2 - 1;
  if (top != bottom) {
    uVar1 = this->mask_;
    do {
      (pRVar3->buffer_)._M_t.
      super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
      .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl[top & uVar2 - 1] =
           (this->buffer_)._M_t.
           super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
           .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl[uVar1 & top];
      top = top + 1;
    } while (bottom != top);
  }
  return pRVar3;
}

Assistant:

RingBuffer<T>* enlarged_copy(size_t bottom, size_t top) const
    {
        RingBuffer<T>* new_buffer = new RingBuffer{ 2 * capacity_ };
        for (size_t i = top; i != bottom; ++i)
            new_buffer->set_entry(i, this->get_entry(i));
        return new_buffer;
    }